

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O1

el_status_t insert_string(char *p)

{
  char *__ptr;
  int iVar1;
  size_t __n;
  size_t __n_00;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  size_t __size;
  
  __n_00 = strlen(p);
  __n = Length;
  pcVar2 = rl_line_buffer;
  __size = Length;
  if (Length <= (long)rl_end + __n_00) {
    __size = __n_00 + Length + 0x40;
    pcVar2 = (char *)malloc(__size);
    __ptr = rl_line_buffer;
    if (pcVar2 == (char *)0x0) {
      return CSstay;
    }
    if (__n != 0) {
      memcpy(pcVar2,rl_line_buffer,__n);
      free(__ptr);
    }
  }
  Length = __size;
  rl_line_buffer = pcVar2;
  iVar1 = rl_point;
  pcVar2 = rl_line_buffer;
  uVar4 = rl_end - rl_point;
  if (uVar4 != 0 && rl_point <= rl_end) {
    lVar3 = (long)rl_point;
    uVar6 = (ulong)uVar4;
    iVar5 = uVar4 + 1;
    do {
      uVar6 = uVar6 - 1;
      pcVar2[(uVar6 & 0xffffffff) + __n_00 + lVar3] = pcVar2[(uVar6 & 0xffffffff) + (long)iVar1];
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  memcpy(rl_line_buffer + rl_point,p,__n_00);
  rl_end = rl_end + (int)__n_00;
  rl_line_buffer[rl_end] = '\0';
  tty_string(rl_line_buffer + rl_point);
  rl_point = rl_point + (int)__n_00;
  return (uint)(rl_point == rl_end) * 2 + CSmove;
}

Assistant:

static el_status_t insert_string(const char *p)
{
    size_t      len;
    int         i;
    char        *line;
    char        *q;

    len = strlen(p);
    if (rl_end + len >= Length) {
        line = malloc(sizeof(char) * (Length + len + MEM_INC));
        if (!line)
            return CSstay;

        if (Length) {
            memcpy(line, rl_line_buffer, Length);
            free(rl_line_buffer);
        }

        rl_line_buffer = line;
        Length += len + MEM_INC;
    }

    for (q = &rl_line_buffer[rl_point], i = rl_end - rl_point; --i >= 0; )
        q[len + i] = q[i];

    memcpy(&rl_line_buffer[rl_point], p, len);
    rl_end += len;
    rl_line_buffer[rl_end] = '\0';
    tty_string(&rl_line_buffer[rl_point]);
    rl_point += len;

    return rl_point == rl_end ? CSstay : CSmove;
}